

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Clara::CommandLine<Catch::ConfigData>::Arg::Arg
          (Arg *this,BoundArgFunction<Catch::ConfigData> *_boundField)

{
  BoundArgFunction<Catch::ConfigData> *_boundField_local;
  Arg *this_local;
  
  Detail::BoundArgFunction<Catch::ConfigData>::BoundArgFunction(&this->boundField,_boundField);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->shortNames);
  std::__cxx11::string::string((string *)&this->longName);
  std::__cxx11::string::string((string *)&this->description);
  std::__cxx11::string::string((string *)&this->hint);
  this->position = -1;
  return;
}

Assistant:

Arg( Detail::BoundArgFunction<ConfigT> const& _boundField ) : boundField( _boundField ), position( -1 ) {}